

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode Curl_multi_wait(Curl_multi *multi,curl_waitfd *extra_fds,uint extra_nfds,int timeout_ms,
                         int *ret,_Bool *gotsocket)

{
  ushort uVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  CURLMcode CVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 extraout_RDX;
  int iVar9;
  int iVar10;
  Curl_easy *pCVar11;
  ushort uVar12;
  pollfd *ufds;
  uint nfds;
  bool bVar13;
  undefined1 auVar14 [16];
  curl_socket_t sockbunch [5];
  long timeout_internal;
  pollfd a_few_on_stack [10];
  uint local_b8 [6];
  int *local_a0;
  _Bool *local_98;
  long local_90;
  pollfd local_88 [11];
  
  uVar8 = (ulong)extra_nfds;
  if (gotsocket != (_Bool *)0x0) {
    *gotsocket = false;
  }
  CVar6 = CURLM_BAD_HANDLE;
  if (((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) &&
     (CVar6 = CURLM_RECURSIVE_API_CALL, multi->in_callback == false)) {
    pCVar11 = multi->easyp;
    local_a0 = ret;
    local_98 = gotsocket;
    if (pCVar11 == (Curl_easy *)0x0) {
      iVar9 = 0;
    }
    else {
      iVar9 = 0;
      do {
        uVar3 = multi_getsock(pCVar11,(curl_socket_t *)local_b8,(int)uVar8);
        uVar7 = 0;
        do {
          if ((uVar3 >> ((uint)uVar7 & 0x1f) & 1) == 0) {
            uVar8 = 0xffffffff;
          }
          else {
            iVar9 = iVar9 + 1;
            uVar8 = (ulong)local_b8[uVar7];
          }
          if (((uVar3 >> ((byte)uVar7 & 0x1f)) >> 0x10 & 1) != 0) {
            iVar9 = iVar9 + 1;
            uVar8 = (ulong)local_b8[uVar7];
          }
        } while (((int)uVar8 != -1) &&
                (uVar8 = uVar7 + 1, bVar13 = uVar7 < 4, uVar7 = uVar8, bVar13));
        pCVar11 = pCVar11->next;
      } while (pCVar11 != (Curl_easy *)0x0);
    }
    multi_timeout(multi,&local_90);
    iVar5 = timeout_ms;
    if (local_90 < timeout_ms) {
      iVar5 = (int)local_90;
    }
    if (local_90 < 0) {
      iVar5 = timeout_ms;
    }
    uVar3 = iVar9 + extra_nfds;
    if (uVar3 < 0xb) {
      auVar14._8_8_ = extraout_RDX;
      auVar14._0_8_ = local_88;
    }
    else {
      auVar14 = (undefined1  [16])(*Curl_cmalloc)((ulong)uVar3 << 3);
      if (auVar14._0_8_ == 0) {
        return CURLM_OUT_OF_MEMORY;
      }
    }
    uVar8 = auVar14._8_8_;
    ufds = auVar14._0_8_;
    nfds = 0;
    if ((iVar9 != 0) && (pCVar11 = multi->easyp, pCVar11 != (Curl_easy *)0x0)) {
      nfds = 0;
      do {
        uVar4 = multi_getsock(pCVar11,(curl_socket_t *)local_b8,(int)uVar8);
        uVar7 = 0;
        do {
          if ((uVar4 >> ((uint)uVar7 & 0x1f) & 1) == 0) {
            uVar8 = 0xffffffff;
          }
          else {
            ufds[nfds].fd = local_b8[uVar7];
            ufds[nfds].events = 1;
            nfds = nfds + 1;
            uVar8 = (ulong)local_b8[uVar7];
          }
          if (((uVar4 >> ((byte)uVar7 & 0x1f)) >> 0x10 & 1) != 0) {
            ufds[nfds].fd = local_b8[uVar7];
            ufds[nfds].events = 4;
            nfds = nfds + 1;
            uVar8 = (ulong)local_b8[uVar7];
          }
        } while (((int)uVar8 != -1) &&
                (uVar8 = uVar7 + 1, bVar13 = uVar7 < 4, uVar7 = uVar8, bVar13));
        pCVar11 = pCVar11->next;
      } while (pCVar11 != (Curl_easy *)0x0);
    }
    piVar2 = local_a0;
    if (extra_nfds != 0) {
      uVar8 = 0;
      do {
        uVar4 = nfds + (int)uVar8;
        ufds[uVar4].fd = extra_fds[uVar8].fd;
        ufds[uVar4].events = 0;
        uVar12 = extra_fds[uVar8].events & 1;
        ufds[uVar4].events = uVar12;
        uVar1 = extra_fds[uVar8].events;
        if ((uVar1 & 2) != 0) {
          ufds[uVar4].events = uVar12 | 2;
        }
        if ((uVar1 & 4) != 0) {
          *(byte *)&ufds[uVar4].events = (byte)ufds[uVar4].events | 4;
        }
        uVar8 = uVar8 + 1;
      } while (extra_nfds != uVar8);
      nfds = nfds + (int)uVar8;
    }
    iVar10 = 0;
    if (((nfds != 0) && (iVar5 = Curl_poll(ufds,nfds,iVar5), iVar10 = 0, 0 < iVar5)) &&
       (iVar10 = iVar5, extra_nfds != 0)) {
      uVar8 = 0;
      do {
        extra_fds[uVar8].revents = ufds[(uint)(iVar9 + (int)uVar8)].revents & 7;
        uVar8 = uVar8 + 1;
      } while (extra_nfds != uVar8);
    }
    if (10 < uVar3) {
      (*Curl_cfree)(ufds);
    }
    if (piVar2 != (int *)0x0) {
      *piVar2 = iVar10;
    }
    CVar6 = CURLM_OK;
    if ((local_98 != (_Bool *)0x0) &&
       (CVar6 = CURLM_OK, extra_fds != (curl_waitfd *)0x0 || iVar9 != 0)) {
      *local_98 = true;
      CVar6 = CURLM_OK;
    }
  }
  return CVar6;
}

Assistant:

CURLMcode Curl_multi_wait(struct Curl_multi *multi,
                          struct curl_waitfd extra_fds[],
                          unsigned int extra_nfds,
                          int timeout_ms,
                          int *ret,
                          bool *gotsocket) /* if any socket was checked */
{
  struct Curl_easy *data;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  unsigned int i;
  unsigned int nfds = 0;
  unsigned int curlfds;
  bool ufds_malloc = FALSE;
  long timeout_internal;
  int retcode = 0;
  struct pollfd a_few_on_stack[NUM_POLLS_ON_STACK];
  struct pollfd *ufds = &a_few_on_stack[0];

  if(gotsocket)
    *gotsocket = FALSE;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  /* Count up how many fds we have from the multi handle */
  data = multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if(bitmap & GETSOCK_READSOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(bitmap & GETSOCK_WRITESOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD) {
        break;
      }
    }

    data = data->next; /* check next handle */
  }

  /* If the internally desired timeout is actually shorter than requested from
     the outside, then use the shorter time! But only if the internal timer
     is actually larger than -1! */
  (void)multi_timeout(multi, &timeout_internal);
  if((timeout_internal >= 0) && (timeout_internal < (long)timeout_ms))
    timeout_ms = (int)timeout_internal;

  curlfds = nfds; /* number of internal file descriptors */
  nfds += extra_nfds; /* add the externally provided ones */

  if(nfds > NUM_POLLS_ON_STACK) {
    /* 'nfds' is a 32 bit value and 'struct pollfd' is typically 8 bytes
       big, so at 2^29 sockets this value might wrap. When a process gets
       the capability to actually handle over 500 million sockets this
       calculation needs a integer overflow check. */
    ufds = malloc(nfds * sizeof(struct pollfd));
    if(!ufds)
      return CURLM_OUT_OF_MEMORY;
    ufds_malloc = TRUE;
  }
  nfds = 0;

  /* only do the second loop if we found descriptors in the first stage run
     above */

  if(curlfds) {
    /* Add the curl handles to our pollfds first */
    data = multi->easyp;
    while(data) {
      bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

      for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
        curl_socket_t s = CURL_SOCKET_BAD;

        if(bitmap & GETSOCK_READSOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLIN;
          ++nfds;
          s = sockbunch[i];
        }
        if(bitmap & GETSOCK_WRITESOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLOUT;
          ++nfds;
          s = sockbunch[i];
        }
        if(s == CURL_SOCKET_BAD) {
          break;
        }
      }

      data = data->next; /* check next handle */
    }
  }

  /* Add external file descriptions from poll-like struct curl_waitfd */
  for(i = 0; i < extra_nfds; i++) {
    ufds[nfds].fd = extra_fds[i].fd;
    ufds[nfds].events = 0;
    if(extra_fds[i].events & CURL_WAIT_POLLIN)
      ufds[nfds].events |= POLLIN;
    if(extra_fds[i].events & CURL_WAIT_POLLPRI)
      ufds[nfds].events |= POLLPRI;
    if(extra_fds[i].events & CURL_WAIT_POLLOUT)
      ufds[nfds].events |= POLLOUT;
    ++nfds;
  }

  if(nfds) {
    int pollrc;
    /* wait... */
    pollrc = Curl_poll(ufds, nfds, timeout_ms);

    if(pollrc > 0) {
      retcode = pollrc;
      /* copy revents results from the poll to the curl_multi_wait poll
         struct, the bit values of the actual underlying poll() implementation
         may not be the same as the ones in the public libcurl API! */
      for(i = 0; i < extra_nfds; i++) {
        unsigned short mask = 0;
        unsigned r = ufds[curlfds + i].revents;

        if(r & POLLIN)
          mask |= CURL_WAIT_POLLIN;
        if(r & POLLOUT)
          mask |= CURL_WAIT_POLLOUT;
        if(r & POLLPRI)
          mask |= CURL_WAIT_POLLPRI;

        extra_fds[i].revents = mask;
      }
    }
  }

  if(ufds_malloc)
    free(ufds);
  if(ret)
    *ret = retcode;
  if(gotsocket && (extra_fds || curlfds))
    /* if any socket was checked */
    *gotsocket = TRUE;

  return CURLM_OK;
}